

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IGXMLScanner2.cpp
# Opt level: O2

void __thiscall
xercesc_4_0::IGXMLScanner::scanRawAttrListforNameSpaces(IGXMLScanner *this,XMLSize_t attCount)

{
  XMLValidator *pXVar1;
  SchemaValidator *pSVar2;
  XMLBufferMgr *pXVar3;
  bool bVar4;
  int iVar5;
  uint uVar6;
  KVStringPair *pKVar7;
  Grammar *pGVar8;
  undefined4 extraout_var;
  XMLBuffer *pXVar9;
  DatatypeValidator *pDVar10;
  undefined1 uVar11;
  XMLCh *pXVar12;
  XMLSize_t index_1;
  XMLSize_t index;
  XMLSize_t XVar13;
  XMLSize_t XVar14;
  XMLCh *pXVar15;
  int colonPos;
  XMLSize_t local_88;
  XMLBufferMgr *local_80;
  XMLCh *local_78;
  XMLBuffer *local_70;
  XMLBuffer *local_68;
  RefHashTableOfEnumerator<xercesc_4_0::Grammar,_xercesc_4_0::StringHasher> i;
  
  local_88 = attCount;
  for (XVar13 = 0; local_88 != XVar13; XVar13 = XVar13 + 1) {
    pKVar7 = BaseRefVectorOf<xercesc_4_0::KVStringPair>::elementAt
                       (&this->fRawAttrList->super_BaseRefVectorOf<xercesc_4_0::KVStringPair>,XVar13
                       );
    pXVar15 = pKVar7->fKey;
    iVar5 = XMLString::compareNString(pXVar15,(XMLCh *)XMLUni::fgXMLNSColonString,6);
    if (iVar5 == 0) {
LAB_002acaa2:
      pXVar12 = pKVar7->fValue;
      updateNSMap(this,pXVar15,pXVar12,this->fRawAttrColonList[XVar13]);
      bVar4 = XMLString::equals(pXVar12,(XMLCh *)SchemaSymbols::fgURI_XSI);
      if (bVar4) {
        this->fSeeXsi = true;
      }
    }
    else {
      bVar4 = XMLString::equals(pXVar15,(XMLCh *)XMLUni::fgXMLNSString);
      if (bVar4) goto LAB_002acaa2;
    }
  }
  if (((this->super_XMLScanner).fDoSchema != false) && (this->fSeeXsi == true)) {
    local_70 = &(this->super_XMLScanner).fURIBuf;
    for (XVar13 = 0; local_88 != XVar13; XVar13 = XVar13 + 1) {
      pKVar7 = BaseRefVectorOf<xercesc_4_0::KVStringPair>::elementAt
                         (&this->fRawAttrList->super_BaseRefVectorOf<xercesc_4_0::KVStringPair>,
                          XVar13);
      pXVar15 = pKVar7->fKey;
      XVar14 = (XMLSize_t)this->fRawAttrColonList[XVar13];
      pXVar12 = L"";
      if (XVar14 != 0xffffffffffffffff) {
        XMLBuffer::set(local_70,pXVar15,XVar14);
        pXVar12 = (this->super_XMLScanner).fURIBuf.fBuffer;
        pXVar12[(this->super_XMLScanner).fURIBuf.fIndex] = L'\0';
      }
      uVar6 = XMLScanner::resolvePrefix(&this->super_XMLScanner,pXVar12,Mode_Attribute);
      if (uVar6 == (this->super_XMLScanner).fSchemaNamespaceId) {
        pXVar12 = pKVar7->fValue;
        pXVar15 = pXVar15 + XVar14 + 1;
        bVar4 = XMLString::equals(pXVar15,(XMLCh *)SchemaSymbols::fgXSI_SCHEMALOCATION);
        if (bVar4) {
          parseSchemaLocation(this,pXVar12,false);
        }
        else {
          bVar4 = XMLString::equals(pXVar15,(XMLCh *)SchemaSymbols::fgXSI_NONAMESPACESCHEMALOCATION)
          ;
          if (bVar4) {
            resolveSchemaGrammar(this,pXVar12,L"",false);
          }
        }
      }
    }
    local_80 = &(this->super_XMLScanner).fBufMgr;
    local_68 = &(this->super_XMLScanner).fPrefixBuf;
    for (XVar13 = 0; XVar13 != local_88; XVar13 = XVar13 + 1) {
      pKVar7 = BaseRefVectorOf<xercesc_4_0::KVStringPair>::elementAt
                         (&this->fRawAttrList->super_BaseRefVectorOf<xercesc_4_0::KVStringPair>,
                          XVar13);
      pXVar15 = pKVar7->fKey;
      XVar14 = (XMLSize_t)this->fRawAttrColonList[XVar13];
      pXVar12 = L"";
      if (XVar14 != 0xffffffffffffffff) {
        XMLBuffer::set(local_70,pXVar15,XVar14);
        pXVar12 = (this->super_XMLScanner).fURIBuf.fBuffer;
        pXVar12[(this->super_XMLScanner).fURIBuf.fIndex] = L'\0';
      }
      uVar6 = XMLScanner::resolvePrefix(&this->super_XMLScanner,pXVar12,Mode_Attribute);
      if (uVar6 == (this->super_XMLScanner).fSchemaNamespaceId) {
        local_78 = pKVar7->fValue;
        pXVar15 = pXVar15 + XVar14 + 1;
        bVar4 = XMLString::equals(pXVar15,(XMLCh *)SchemaSymbols::fgXSI_TYPE);
        if (!bVar4) {
          bVar4 = XMLString::equals(pXVar15,L"nil");
          if (!bVar4) goto LAB_002acf20;
        }
        pXVar1 = (this->super_XMLScanner).fValidator;
        if (pXVar1 == (XMLValidator *)0x0) {
LAB_002accaf:
          (*((this->super_XMLScanner).fGrammarResolver)->fGrammarPool->_vptr_XMLGrammarPool[5])(&i);
          do {
            if ((i.fCurElem == (RefHashTableBucketElem<xercesc_4_0::Grammar> *)0x0) &&
               (i.fCurHash == (i.fToEnum)->fHashModulus)) goto LAB_002acd08;
            pGVar8 = RefHashTableOfEnumerator<xercesc_4_0::Grammar,_xercesc_4_0::StringHasher>::
                     nextElement(&i);
            iVar5 = (*(pGVar8->super_XSerializable)._vptr_XSerializable[5])(pGVar8);
          } while (iVar5 != 1);
          iVar5 = (*(pGVar8->super_XSerializable)._vptr_XSerializable[6])(pGVar8);
          switchGrammar(this,(XMLCh *)CONCAT44(extraout_var,iVar5));
LAB_002acd08:
          RefHashTableOfEnumerator<xercesc_4_0::Grammar,_xercesc_4_0::StringHasher>::
          ~RefHashTableOfEnumerator(&i);
        }
        else {
          iVar5 = (*pXVar1->_vptr_XMLValidator[0xd])();
          if ((char)iVar5 == '\0') goto LAB_002accaf;
        }
        pXVar1 = (this->super_XMLScanner).fValidator;
        if (pXVar1 != (XMLValidator *)0x0) {
          iVar5 = (*pXVar1->_vptr_XMLValidator[0xd])();
          if ((char)iVar5 != '\0') {
            bVar4 = XMLString::equals(pXVar15,(XMLCh *)SchemaSymbols::fgXSI_TYPE);
            pXVar3 = local_80;
            if (bVar4) {
              pXVar9 = XMLBufferMgr::bidOnBuffer(local_80);
              i._8_8_ = pXVar3;
              i.super_XMLEnumerator<xercesc_4_0::Grammar>._vptr_XMLEnumerator = (_func_int **)pXVar9
              ;
              pDVar10 = RefHashTableOf<xercesc_4_0::DatatypeValidator,_xercesc_4_0::StringHasher>::
                        get(DatatypeValidatorFactory::fBuiltInRegistry,SchemaSymbols::fgDT_QNAME);
              normalizeAttRawValue(this,(XMLCh *)SchemaSymbols::fgXSI_TYPE,local_78,pXVar9);
              pSVar2 = (SchemaValidator *)(this->super_XMLScanner).fValidator;
              pXVar15 = pXVar9->fBuffer;
              pXVar15[pXVar9->fIndex] = L'\0';
              SchemaValidator::normalizeWhiteSpace(pSVar2,pDVar10,pXVar15,pXVar9,true);
              if (pXVar9->fIndex != 0) {
                colonPos = -1;
                pXVar15 = pXVar9->fBuffer;
                pXVar15[pXVar9->fIndex] = L'\0';
                uVar6 = XMLScanner::resolveQName
                                  (&this->super_XMLScanner,pXVar15,local_68,Mode_Element,&colonPos);
                pXVar15 = (this->super_XMLScanner).fPrefixBuf.fBuffer;
                pSVar2 = (SchemaValidator *)(this->super_XMLScanner).fValidator;
                pXVar15[(this->super_XMLScanner).fPrefixBuf.fIndex] = L'\0';
                pXVar12 = pXVar9->fBuffer;
                pXVar12[pXVar9->fIndex] = L'\0';
                SchemaValidator::setXsiType(pSVar2,pXVar15,pXVar12 + (long)colonPos + 1,uVar6);
              }
            }
            else {
              bVar4 = XMLString::equals(pXVar15,L"nil");
              pXVar3 = local_80;
              if (!bVar4) goto LAB_002acf20;
              pXVar9 = XMLBufferMgr::bidOnBuffer(local_80);
              i._8_8_ = pXVar3;
              i.super_XMLEnumerator<xercesc_4_0::Grammar>._vptr_XMLEnumerator = (_func_int **)pXVar9
              ;
              pDVar10 = RefHashTableOf<xercesc_4_0::DatatypeValidator,_xercesc_4_0::StringHasher>::
                        get(DatatypeValidatorFactory::fBuiltInRegistry,SchemaSymbols::fgDT_BOOLEAN);
              pXVar12 = local_78;
              normalizeAttRawValue(this,L"nil",local_78,pXVar9);
              pSVar2 = (SchemaValidator *)(this->super_XMLScanner).fValidator;
              pXVar15 = pXVar9->fBuffer;
              pXVar15[pXVar9->fIndex] = L'\0';
              SchemaValidator::normalizeWhiteSpace(pSVar2,pDVar10,pXVar15,pXVar9,true);
              pXVar15 = pXVar9->fBuffer;
              pXVar15[pXVar9->fIndex] = L'\0';
              bVar4 = XMLString::equals(pXVar15,(XMLCh *)SchemaSymbols::fgATTVAL_TRUE);
              uVar11 = 1;
              if (!bVar4) {
                pXVar15 = pXVar9->fBuffer;
                pXVar15[pXVar9->fIndex] = L'\0';
                bVar4 = XMLString::equals(pXVar15,(XMLCh *)SchemaSymbols::fgATTVAL_FALSE);
                if (!bVar4) {
                  pXVar15 = pXVar9->fBuffer;
                  pXVar15[pXVar9->fIndex] = L'\0';
                  XMLScanner::emitError
                            (&this->super_XMLScanner,InvalidAttValue,pXVar15,pXVar12,(XMLCh *)0x0,
                             (XMLCh *)0x0);
                  goto LAB_002acf18;
                }
                uVar11 = 0;
              }
              pXVar1 = (this->super_XMLScanner).fValidator;
              *(undefined1 *)&pXVar1[1].fScanner = uVar11;
              *(undefined1 *)((long)&pXVar1[1].fScanner + 1) = 1;
            }
LAB_002acf18:
            XMLBufBid::~XMLBufBid((XMLBufBid *)&i);
          }
        }
      }
LAB_002acf20:
    }
  }
  return;
}

Assistant:

void IGXMLScanner::scanRawAttrListforNameSpaces(XMLSize_t attCount)
{
    //  Make an initial pass through the list and find any xmlns attributes or
    //  schema attributes.
    //  When we find one, send it off to be used to update the element stack's
    //  namespace mappings.
    for (XMLSize_t index = 0; index < attCount; index++)
    {
        // each attribute has the prefix:suffix="value"
        const KVStringPair* curPair = fRawAttrList->elementAt(index);
        const XMLCh* rawPtr = curPair->getKey();

        //  If either the key begins with "xmlns:" or its just plain
        //  "xmlns", then use it to update the map.
        if (!XMLString::compareNString(rawPtr, XMLUni::fgXMLNSColonString, 6)
        ||  XMLString::equals(rawPtr, XMLUni::fgXMLNSString))
        {
            const XMLCh* valuePtr = curPair->getValue();

            updateNSMap(rawPtr, valuePtr, fRawAttrColonList[index]);

            // if the schema URI is seen in the the valuePtr, set the boolean seeXsi
            if (XMLString::equals(valuePtr, SchemaSymbols::fgURI_XSI)) {
                fSeeXsi = true;
            }
        }
    }

    // walk through the list again to deal with "xsi:...."
    if (fDoSchema && fSeeXsi)
    {
        for (XMLSize_t index = 0; index < attCount; index++)
        {
            // each attribute has the prefix:suffix="value"
            const KVStringPair* curPair = fRawAttrList->elementAt(index);
            const XMLCh* rawPtr = curPair->getKey();
            const XMLCh* prefPtr = XMLUni::fgZeroLenString;
            int   colonInd = fRawAttrColonList[index];

            if (colonInd != -1) {

                fURIBuf.set(rawPtr, colonInd);
                prefPtr = fURIBuf.getRawBuffer();
            }

            // if schema URI has been seen, scan for the schema location and uri
            // and resolve the schema grammar
            if (resolvePrefix(prefPtr, ElemStack::Mode_Attribute) == fSchemaNamespaceId) {

                const XMLCh* valuePtr = curPair->getValue();
                const XMLCh* suffPtr = &rawPtr[colonInd + 1];

                if (XMLString::equals(suffPtr, SchemaSymbols::fgXSI_SCHEMALOCATION))
                    parseSchemaLocation(valuePtr);
                else if (XMLString::equals(suffPtr, SchemaSymbols::fgXSI_NONAMESPACESCHEMALOCATION))
                    resolveSchemaGrammar(valuePtr, XMLUni::fgZeroLenString);
            }
        }

        // do it another time, as xsi:type and xsi:nill only work if the schema grammar has been already
        // loaded (JIRA XERCESC-1937)
        for (XMLSize_t index = 0; index < attCount; index++)
        {
            const KVStringPair* curPair = fRawAttrList->elementAt(index);
            const XMLCh* rawPtr = curPair->getKey();
            const XMLCh* prefPtr = XMLUni::fgZeroLenString;
            int   colonInd = fRawAttrColonList[index];

            if (colonInd != -1) {

                fURIBuf.set(rawPtr, colonInd);
                prefPtr = fURIBuf.getRawBuffer();
            }

            // scan for schema type
            if (resolvePrefix(prefPtr, ElemStack::Mode_Attribute) == fSchemaNamespaceId) {

                const XMLCh* valuePtr = curPair->getValue();
                const XMLCh*  suffPtr = &rawPtr[colonInd + 1];

                if(XMLString::equals(suffPtr, SchemaSymbols::fgXSI_TYPE) ||
                   XMLString::equals(suffPtr, SchemaSymbols::fgATT_NILL))
                {
                    if (!fValidator || !fValidator->handlesSchema())
                    {
                        // If we are in the DTD mode, try to switch to the Schema
                        // mode. For that we need to find any XML Schema grammar
                        // that we can switch to. Such a grammar can only come
                        // from the cache (if it came from the schemaLocation
                        // attribute, we would be in the Schema mode already).
                        //
                        XMLGrammarPool* pool = fGrammarResolver->getGrammarPool ();
                        RefHashTableOfEnumerator<Grammar> i = pool->getGrammarEnumerator ();

                        while (i.hasMoreElements ())
                        {
                            Grammar& gr (i.nextElement ());

                            if (gr.getGrammarType () == Grammar::SchemaGrammarType)
                            {
                                switchGrammar (gr.getTargetNamespace ());
                                break;
                            }
                        }
                    }

                    if( fValidator && fValidator->handlesSchema() )
                    {
                        if (XMLString::equals(suffPtr, SchemaSymbols::fgXSI_TYPE))
                        {
                            XMLBufBid bbXsi(&fBufMgr);
                            XMLBuffer& fXsiType = bbXsi.getBuffer();

                            // normalize the attribute according to schema whitespace facet
                            DatatypeValidator* tempDV = DatatypeValidatorFactory::getBuiltInRegistry()->get(SchemaSymbols::fgDT_QNAME);
                            normalizeAttRawValue(SchemaSymbols::fgXSI_TYPE, valuePtr, fXsiType);
                            ((SchemaValidator*) fValidator)->normalizeWhiteSpace(tempDV, fXsiType.getRawBuffer(), fXsiType, true);
                            if (!fXsiType.isEmpty()) {
                                int colonPos = -1;
                                unsigned int uriId = resolveQName (
                                      fXsiType.getRawBuffer()
                                    , fPrefixBuf
                                    , ElemStack::Mode_Element
                                    , colonPos
                                );
                                ((SchemaValidator*)fValidator)->setXsiType(fPrefixBuf.getRawBuffer(), fXsiType.getRawBuffer() + colonPos + 1, uriId);
                            }
                        }
                        else if (XMLString::equals(suffPtr, SchemaSymbols::fgATT_NILL))
                        {
                            // normalize the attribute according to schema whitespace facet
                            XMLBufBid bbXsi(&fBufMgr);
                            XMLBuffer& fXsiNil = bbXsi.getBuffer();

                            DatatypeValidator* tempDV = DatatypeValidatorFactory::getBuiltInRegistry()->get(SchemaSymbols::fgDT_BOOLEAN);
                            normalizeAttRawValue(SchemaSymbols::fgATT_NILL, valuePtr, fXsiNil);
                            ((SchemaValidator*) fValidator)->normalizeWhiteSpace(tempDV, fXsiNil.getRawBuffer(), fXsiNil, true);
                            if(XMLString::equals(fXsiNil.getRawBuffer(), SchemaSymbols::fgATTVAL_TRUE))
                                ((SchemaValidator*)fValidator)->setNillable(true);
                            else if(XMLString::equals(fXsiNil.getRawBuffer(), SchemaSymbols::fgATTVAL_FALSE))
                                ((SchemaValidator*)fValidator)->setNillable(false);
                            else
                                emitError(XMLErrs::InvalidAttValue, fXsiNil.getRawBuffer(), valuePtr);
                        }
                    }
                }
            }
        }
    }

}